

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_wnorm
                   (char_t *s,char_t end_quote)

{
  byte *pbVar1;
  byte *pbVar2;
  char in_SIL;
  gap *in_RDI;
  char_t *str_2;
  char_t *str_1;
  char_t ss;
  char_t *str;
  gap g;
  byte *local_48;
  char_t *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  byte bVar3;
  gap *in_stack_ffffffffffffffd0;
  gap *pgVar4;
  gap local_28;
  char local_11;
  gap *local_10;
  
  local_11 = in_SIL;
  local_10 = in_RDI;
  gap::gap(&local_28);
  pgVar4 = local_10;
  if (((anonymous_namespace)::chartype_table[*(byte *)&local_10->end] & 8) != 0) {
    do {
      in_stack_ffffffffffffffd0 = (gap *)((long)&pgVar4->end + 1);
      pgVar4 = in_stack_ffffffffffffffd0;
    } while (((anonymous_namespace)::chartype_table[*(byte *)&in_stack_ffffffffffffffd0->end] & 8)
             != 0);
    gap::push(in_stack_ffffffffffffffd0,
              (char_t **)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
              (size_t)in_stack_ffffffffffffffc0);
    pgVar4 = local_10;
  }
  do {
    while (local_10 = pgVar4, bVar3 = *(byte *)&local_10->end,
          ((anonymous_namespace)::chartype_table[bVar3] & 0xc) != 0) {
LAB_00edc08a:
      if (*(char *)&local_10->end == local_11) {
        pbVar1 = (byte *)gap::flush((gap *)CONCAT17(bVar3,in_stack_ffffffffffffffc8),
                                    in_stack_ffffffffffffffc0);
        do {
          pbVar2 = pbVar1 + -1;
          *pbVar1 = 0;
          pbVar1 = pbVar2;
        } while (((anonymous_namespace)::chartype_table[*pbVar2] & 8) != 0);
        return (char_t *)((long)&local_10->end + 1);
      }
      if (((anonymous_namespace)::chartype_table[*(byte *)&local_10->end] & 8) == 0) {
        if (*(char *)&local_10->end == '\0') {
          return (char_t *)0x0;
        }
        pgVar4 = (gap *)((long)&local_10->end + 1);
      }
      else {
        pgVar4 = (gap *)((long)&local_10->end + 1);
        *(undefined1 *)&local_10->end = 0x20;
        if (((anonymous_namespace)::chartype_table[*(byte *)&pgVar4->end] & 8) != 0) {
          local_48 = (byte *)((long)&local_10->end + 2);
          while (((anonymous_namespace)::chartype_table[*local_48] & 8) != 0) {
            local_48 = local_48 + 1;
          }
          local_10 = pgVar4;
          gap::push(in_stack_ffffffffffffffd0,(char_t **)CONCAT17(bVar3,in_stack_ffffffffffffffc8),
                    (size_t)in_stack_ffffffffffffffc0);
          pgVar4 = local_10;
        }
      }
    }
    bVar3 = *(byte *)((long)&local_10->end + 1);
    if (((anonymous_namespace)::chartype_table[bVar3] & 0xc) != 0) {
      local_10 = (gap *)((long)&local_10->end + 1);
      goto LAB_00edc08a;
    }
    bVar3 = *(byte *)((long)&local_10->end + 2);
    if (((anonymous_namespace)::chartype_table[bVar3] & 0xc) != 0) {
      local_10 = (gap *)((long)&local_10->end + 2);
      goto LAB_00edc08a;
    }
    bVar3 = *(byte *)((long)&local_10->end + 3);
    if (((anonymous_namespace)::chartype_table[bVar3] & 0xc) != 0) {
      local_10 = (gap *)((long)&local_10->end + 3);
      goto LAB_00edc08a;
    }
    pgVar4 = (gap *)((long)&local_10->end + 4);
  } while( true );
}

Assistant:

static char_t* parse_wnorm(char_t* s, char_t end_quote)
		{
			gap g;

			// trim leading whitespaces
			if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
			{
				char_t* str = s;

				do ++str;
				while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space));

				g.push(s, str - s);
			}

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr_ws | ct_space));

				if (*s == end_quote)
				{
					char_t* str = g.flush(s);

					do *str-- = 0;
					while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space));

					return s + 1;
				}
				else if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
				{
					*s++ = ' ';

					if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
					{
						char_t* str = s + 1;
						while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space)) ++str;

						g.push(s, str - s);
					}
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}